

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall mkvparser::Chapters::Parse(Chapters *this)

{
  long lVar1;
  Chapters *pos_00;
  undefined8 *in_RDI;
  long status;
  longlong size;
  longlong id;
  longlong stop;
  longlong pos;
  IMkvReader *pReader;
  longlong *in_stack_ffffffffffffffc8;
  longlong *in_stack_ffffffffffffffd0;
  Chapters *this_00;
  IMkvReader *pReader_00;
  
  pReader_00 = *(IMkvReader **)*in_RDI;
  pos_00 = (Chapters *)in_RDI[1];
  this_00 = (Chapters *)((long)&pos_00->m_pSegment + in_RDI[2]);
  while( true ) {
    if ((long)this_00 <= (long)pos_00) {
      if (pos_00 != this_00) {
        return -2;
      }
      return 0;
    }
    lVar1 = ParseElementHeader(pReader_00,(longlong *)pos_00,(longlong)this_00,
                               in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    if (lVar1 < 0) break;
    if (in_stack_ffffffffffffffc8 != (longlong *)0x0) {
      if ((in_stack_ffffffffffffffd0 == (longlong *)0x45b9) &&
         (lVar1 = ParseEdition(this_00,0x45b9,(longlong)in_stack_ffffffffffffffc8), lVar1 < 0)) {
        return lVar1;
      }
      pos_00 = (Chapters *)((long)in_stack_ffffffffffffffc8 + (long)pos_00);
      if ((long)this_00 < (long)pos_00) {
        return -2;
      }
    }
  }
  return lVar1;
}

Assistant:

long Chapters::Parse() {
  IMkvReader* const pReader = m_pSegment->m_pReader;

  long long pos = m_start;  // payload start
  const long long stop = pos + m_size;  // payload stop

  while (pos < stop) {
    long long id, size;

    long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (size == 0)  // weird
      continue;

    if (id == libwebm::kMkvEditionEntry) {
      status = ParseEdition(pos, size);

      if (status < 0)  // error
        return status;
    }

    pos += size;
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;
  return 0;
}